

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlParseScript(htmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *str;
  _xmlSAXHandler *p_Var3;
  uint val;
  int iVar4;
  cdataBlockSAXFunc p_Var5;
  xmlChar *pxVar6;
  uint uVar7;
  int l;
  xmlChar buf [1005];
  int local_42c;
  xmlChar local_428 [1016];
  
  pxVar2 = ctxt->input;
  pxVar6 = pxVar2->cur + -(long)pxVar2->base;
  if ((500 < (long)pxVar6) && (pxVar6 = pxVar2->end + -(long)pxVar2->cur, (long)pxVar6 < 500)) {
    xmlParserInputShrink(pxVar2);
  }
  val = htmlCurrentChar(ctxt,&local_42c);
  uVar7 = 0;
  do {
    iVar4 = (int)pxVar6;
    if (val == 0x3c) {
      pxVar6 = ctxt->input->cur;
      if (pxVar6[1] == '/') {
        if (ctxt->recovery == 0) {
          if ((byte)((pxVar6[2] & 0xdf) + 0xbf) < 0x1a) goto LAB_00151a4a;
        }
        else {
          str = ctxt->name;
          iVar4 = xmlStrlen(str);
          iVar4 = xmlStrncasecmp(str,pxVar6 + 2,iVar4);
          if (iVar4 == 0) {
LAB_00151a4a:
            if (((uVar7 != 0) && (p_Var3 = ctxt->sax, p_Var3 != (_xmlSAXHandler *)0x0)) &&
               (ctxt->disableSAX == 0)) {
              local_428[(int)uVar7] = '\0';
              p_Var5 = p_Var3->cdataBlock;
              if ((p_Var5 != (cdataBlockSAXFunc)0x0) ||
                 (p_Var5 = p_Var3->characters, p_Var5 != (cdataBlockSAXFunc)0x0)) {
                (*p_Var5)(ctxt->userData,local_428,uVar7);
              }
            }
            return;
          }
          pxVar6 = ctxt->name;
          htmlParseErr(ctxt,XML_ERR_TAG_NAME_MISMATCH,"Element %s embeds close tag\n",pxVar6,
                       (xmlChar *)0x0);
          iVar4 = (int)pxVar6;
        }
      }
    }
    else if (val == 0) goto LAB_00151a4a;
    if ((int)val < 0x100) {
      if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0))))
      goto LAB_0015197c;
LAB_00151931:
      if (local_42c == 1) {
        local_428[(int)uVar7] = (xmlChar)val;
        uVar7 = uVar7 + 1;
      }
      else {
        iVar4 = xmlCopyChar(local_42c,local_428 + (int)uVar7,val);
        uVar7 = uVar7 + iVar4;
      }
    }
    else {
      uVar1 = val - 0xe000;
      iVar4 = CONCAT31((int3)(uVar1 >> 8),uVar1 < 0x1ffe);
      if ((val - 0x10000 < 0x100000 || uVar1 < 0x1ffe) || (int)val < 0xd800) goto LAB_00151931;
LAB_0015197c:
      htmlParseErrInt(ctxt,0x1f95cb,(char *)(ulong)val,iVar4);
    }
    if (999 < (int)uVar7) {
      local_428[uVar7] = '\0';
      p_Var5 = ctxt->sax->cdataBlock;
      if ((p_Var5 != (cdataBlockSAXFunc)0x0) ||
         (p_Var5 = ctxt->sax->characters, p_Var5 != (cdataBlockSAXFunc)0x0)) {
        (*p_Var5)(ctxt->userData,local_428,uVar7);
      }
      uVar7 = 0;
    }
    if ((ctxt->progressive == 0) &&
       (pxVar2 = ctxt->input, (long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
      xmlParserInputGrow(pxVar2,0xfa);
    }
    pxVar2 = ctxt->input;
    pxVar6 = pxVar2->cur;
    if (*pxVar6 == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    ctxt->token = 0;
    pxVar6 = pxVar6 + local_42c;
    pxVar2->cur = pxVar6;
    val = htmlCurrentChar(ctxt,&local_42c);
  } while( true );
}

Assistant:

static void
htmlParseScript(htmlParserCtxtPtr ctxt) {
    xmlChar buf[HTML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur,l;

    SHRINK;
    cur = CUR_CHAR(l);
    while (cur != 0) {
	if ((cur == '<') && (NXT(1) == '/')) {
            /*
             * One should break here, the specification is clear:
             * Authors should therefore escape "</" within the content.
             * Escape mechanisms are specific to each scripting or
             * style sheet language.
             *
             * In recovery mode, only break if end tag match the
             * current tag, effectively ignoring all tags inside the
             * script/style block and treating the entire block as
             * CDATA.
             */
            if (ctxt->recovery) {
                if (xmlStrncasecmp(ctxt->name, ctxt->input->cur+2,
				   xmlStrlen(ctxt->name)) == 0)
                {
                    break; /* while */
                } else {
		    htmlParseErr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
				 "Element %s embeds close tag\n",
		                 ctxt->name, NULL);
		}
            } else {
                if (((NXT(2) >= 'A') && (NXT(2) <= 'Z')) ||
                    ((NXT(2) >= 'a') && (NXT(2) <= 'z')))
                {
                    break; /* while */
                }
            }
	}
        if (IS_CHAR(cur)) {
	    COPY_BUF(l,buf,nbchar,cur);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in CDATA 0x%X\n", cur);
        }
	if (nbchar >= HTML_PARSER_BIG_BUFFER_SIZE) {
            buf[nbchar] = 0;
	    if (ctxt->sax->cdataBlock!= NULL) {
		/*
		 * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
		 */
		ctxt->sax->cdataBlock(ctxt->userData, buf, nbchar);
	    } else if (ctxt->sax->characters != NULL) {
		ctxt->sax->characters(ctxt->userData, buf, nbchar);
	    }
	    nbchar = 0;
	}
	GROW;
	NEXTL(l);
	cur = CUR_CHAR(l);
    }

    if ((nbchar != 0) && (ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        buf[nbchar] = 0;
	if (ctxt->sax->cdataBlock!= NULL) {
	    /*
	     * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
	     */
	    ctxt->sax->cdataBlock(ctxt->userData, buf, nbchar);
	} else if (ctxt->sax->characters != NULL) {
	    ctxt->sax->characters(ctxt->userData, buf, nbchar);
	}
    }
}